

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setting.cc
# Opt level: O0

bool __thiscall xsettingsd::ColorSetting::EqualsImpl(ColorSetting *this,Setting *other)

{
  bool local_41;
  long local_40;
  ColorSetting *cast_other;
  Setting *other_local;
  ColorSetting *this_local;
  
  if (other == (Setting *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(other,&Setting::typeinfo,&typeinfo,0);
  }
  if (local_40 == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_41 = false;
    if (((*(uint16_t *)(local_40 + 0x10) == this->red_) &&
        (local_41 = false, *(uint16_t *)(local_40 + 0x12) == this->green_)) &&
       (local_41 = false, *(uint16_t *)(local_40 + 0x14) == this->blue_)) {
      local_41 = *(uint16_t *)(local_40 + 0x16) == this->alpha_;
    }
    this_local._7_1_ = local_41;
  }
  return this_local._7_1_;
}

Assistant:

bool ColorSetting::EqualsImpl(const Setting& other) const {
  const ColorSetting* cast_other = dynamic_cast<const ColorSetting*>(&other);
  if (!cast_other)
    return false;
  return (cast_other->red_ == red_ &&
          cast_other->green_ == green_ &&
          cast_other->blue_ == blue_ &&
          cast_other->alpha_ == alpha_);
}